

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

void __thiscall spdlog::logger::flush_(logger *this)

{
  bool bVar1;
  element_type *peVar2;
  long in_RDI;
  exception *ex;
  shared_ptr<spdlog::sinks::sink> *sink;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  *__range1;
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  *in_stack_ffffffffffffff48;
  __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
  *in_stack_ffffffffffffff50;
  __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
  local_18;
  long local_10;
  
  local_10 = in_RDI + 0x28;
  local_18._M_current =
       (shared_ptr<spdlog::sinks::sink> *)
       std::
       vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
       ::begin(in_stack_ffffffffffffff48);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
    ::operator*(&local_18);
    peVar2 = std::__shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x337fd2);
    (*peVar2->_vptr_sink[3])();
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

SPDLOG_INLINE void logger::flush_() {
    for (auto &sink : sinks_) {
        SPDLOG_TRY { sink->flush(); }
        SPDLOG_LOGGER_CATCH(source_loc())
    }
}